

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_writer_flush_unchecked(mpack_writer_t *writer)

{
  size_t sVar1;
  size_t used;
  mpack_writer_t *writer_local;
  
  sVar1 = mpack_writer_buffer_used(writer);
  writer->current = writer->buffer;
  (*writer->flush)(writer,writer->buffer,sVar1);
  return;
}

Assistant:

MPACK_STATIC_INLINE void mpack_writer_flush_unchecked(mpack_writer_t* writer) {
    // This is a bit ugly; we reset used before calling flush so that
    // a flush function can distinguish between flushing the buffer
    // versus flushing external data. see mpack_growable_writer_flush()
    size_t used = mpack_writer_buffer_used(writer);
    writer->current = writer->buffer;
    writer->flush(writer, writer->buffer, used);
}